

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<bool>::add_sample(TypedTimeSamples<bool> *this,double t,bool *v)

{
  undefined1 local_30 [8];
  Sample s;
  bool *v_local;
  double t_local;
  TypedTimeSamples<bool> *this_local;
  
  s._8_8_ = v;
  Sample::Sample((Sample *)local_30);
  s.t._0_1_ = *(byte *)s._8_8_ & 1;
  local_30 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<bool>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<bool>::Sample,std::allocator<tinyusdz::TypedTimeSamples<bool>::Sample>>
              *)this,(Sample *)local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }